

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CharMap.h
# Opt level: O2

void __thiscall
UnifiedRegex::CharMap<char16_t,_int,_(UnifiedRegex::CharMapScheme)1>::Inner::FreeSelf
          (Inner *this,ArenaAllocator *allocator)

{
  Node *pNVar1;
  long lVar2;
  
  for (lVar2 = 1; lVar2 != 0x11; lVar2 = lVar2 + 1) {
    pNVar1 = this->children[lVar2 + -1];
    if (pNVar1 != (Node *)0x0) {
      (**pNVar1->_vptr_Node)(pNVar1,allocator);
      this->children[lVar2 + -1] = (Node *)0x0;
    }
  }
  Memory::
  DeleteObject<Memory::ArenaAllocator,(Memory::AllocatorDeleteFlags)0,UnifiedRegex::CharMap<char16_t,int,(UnifiedRegex::CharMapScheme)1>::Inner>
            (allocator,this);
  return;
}

Assistant:

void FreeSelf(ArenaAllocator* allocator) override
            {
                for (int i = 0; i < branchingPerLevel; i++)
                {
                    if (children[i] != 0)
                    {
                        children[i]->FreeSelf(allocator);
#if DBG
                        children[i] = 0;
#endif
                    }
                }
                Adelete(allocator, this);
            }